

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_sparse.hpp
# Opt level: O0

const_reference __thiscall
boost::numeric::ublas::
mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
::operator()(mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
             *this,size_type i)

{
  bool bVar1;
  reference ppVar2;
  mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  *in_RDI;
  const_subiterator_type it;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20 [3];
  double *local_8;
  
  data(in_RDI);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x8ac7ea);
  data(in_RDI);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::operator==(local_20,&local_28);
  if (bVar1) {
    local_8 = (double *)
              &mapped_vector<double,boost::numeric::ublas::map_std<unsigned_long,double,std::allocator<std::pair<unsigned_long_const,double>>>>
               ::zero_;
  }
  else {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_double>_>::operator*
                       ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_double>_> *)0x8ac833
                       );
    local_8 = &ppVar2->second;
  }
  return local_8;
}

Assistant:

BOOST_UBLAS_INLINE
        const_reference operator () (size_type i) const {
            BOOST_UBLAS_CHECK (i < size_, bad_index ());
            const_subiterator_type it (data ().find (i));
            if (it == data ().end ())
                return zero_;
            BOOST_UBLAS_CHECK ((*it).first == i, internal_logic ());   // broken map
            return (*it).second;
        }